

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

PNode * find_PNode(Parser *p,char *start,char *end_skip,int symbol,D_Scope *sc,uint *hash)

{
  uint32 *puVar1;
  PNode **ppPVar2;
  PNode *pPVar3;
  PNode *pPVar4;
  PNode *pPVar5;
  PNode *_t;
  uint uVar6;
  PNode *pn;
  PNode *pPVar7;
  
  uVar6 = (int)end_skip * 0x10000 + (int)start * 0x100 + (int)sc + symbol;
  *hash = uVar6;
  ppPVar2 = (p->pnode_hash).v;
  if (ppPVar2 == (PNode **)0x0) {
    pPVar4 = (PNode *)0x0;
  }
  else {
    pPVar4 = (PNode *)0x0;
    pPVar7 = ppPVar2[(ulong)uVar6 % (ulong)(p->pnode_hash).m];
    if (pPVar7 != (PNode *)0x0) {
      pPVar5 = (PNode *)0x0;
      do {
        pPVar4 = pPVar5;
        if ((((pPVar7->hash == uVar6) && ((pPVar7->parse_node).symbol == symbol)) &&
            ((pPVar7->parse_node).start_loc.s == start)) &&
           (((pPVar7->parse_node).end_skip == end_skip && (pPVar7->initial_scope == sc)))) {
          pPVar4 = pPVar7->latest;
          pPVar3 = pPVar4->latest;
          pn = pPVar4;
          if (pPVar4 != pPVar4->latest) {
            do {
              pPVar4 = pPVar3;
              pPVar4->refcount = pPVar4->refcount + 1;
              puVar1 = &pn->refcount;
              *puVar1 = *puVar1 - 1;
              if (*puVar1 == 0) {
                free_PNode(p,pn);
              }
              pPVar7->latest = pPVar4;
              pPVar3 = pPVar4->latest;
              pn = pPVar4;
            } while (pPVar4 != pPVar4->latest);
          }
          if (pPVar5 != pPVar4 && pPVar5 != (PNode *)0x0) {
            __assert_fail("!result || result == t",
                          "/workspace/llm4binary/github/license_c_cmakelists/jplevyak[P]dparser/parse.c"
                          ,0x135,
                          "PNode *find_PNode(Parser *, char *, char *, int, D_Scope *, uint *)");
          }
        }
        pPVar7 = pPVar7->bucket_next;
        pPVar5 = pPVar4;
      } while (pPVar7 != (PNode *)0x0);
    }
  }
  return pPVar4;
}

Assistant:

PNode *find_PNode(Parser *p, char *start, char *end_skip, int symbol, D_Scope *sc, uint *hash) {
  PNodeHash *ph = &p->pnode_hash;
  PNode *pn;
  uint h = PNODE_HASH(start, end_skip, symbol, sc);
  *hash = h;
  PNode *result = NULL;
  if (ph->v)
    for (pn = ph->v[h % ph->m]; pn; pn = pn->bucket_next)
      if (pn->hash == h && pn->parse_node.symbol == symbol && pn->parse_node.start_loc.s == start &&
          pn->parse_node.end_skip == end_skip && pn->initial_scope == sc) {
        PNode *t = pn;
        LATEST(p, t);
        assert(!result  || result == t);
        result = t;
      }
  return result;
}